

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlChar * xmlSchemaValueGetAsString(xmlSchemaValPtr val)

{
  xmlSchemaValType xVar1;
  xmlSchemaValPtr val_local;
  
  if (val == (xmlSchemaValPtr)0x0) {
    val_local = (xmlSchemaValPtr)0x0;
  }
  else {
    xVar1 = val->type;
    if ((((xVar1 - XML_SCHEMAS_STRING < 2) || (xVar1 - XML_SCHEMAS_TOKEN < 3)) ||
        (xVar1 == XML_SCHEMAS_NAME)) ||
       (((xVar1 - XML_SCHEMAS_NCNAME < 3 || (xVar1 == XML_SCHEMAS_ENTITY)) ||
        ((xVar1 == XML_SCHEMAS_ANYURI || (xVar1 == XML_SCHEMAS_ANYSIMPLETYPE)))))) {
      val_local = (xmlSchemaValPtr)(val->value).qname.name;
    }
    else {
      val_local = (xmlSchemaValPtr)0x0;
    }
  }
  return (xmlChar *)val_local;
}

Assistant:

const xmlChar *
xmlSchemaValueGetAsString(xmlSchemaValPtr val)
{
    if (val == NULL)
	return (NULL);
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_NORMSTRING:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	case XML_SCHEMAS_TOKEN:
        case XML_SCHEMAS_LANGUAGE:
        case XML_SCHEMAS_NMTOKEN:
        case XML_SCHEMAS_NAME:
        case XML_SCHEMAS_NCNAME:
        case XML_SCHEMAS_ID:
        case XML_SCHEMAS_IDREF:
        case XML_SCHEMAS_ENTITY:
        case XML_SCHEMAS_ANYURI:
	    return (BAD_CAST val->value.str);
	default:
	    break;
    }
    return (NULL);
}